

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayoutPrivate::setupVerticalLayoutData(QFormLayoutPrivate *this,int width)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  RowWrapPolicy RVar4;
  int iVar5;
  int iVar6;
  Int IVar7;
  Int IVar8;
  QWidget *pQVar9;
  QFormLayoutItem **ppQVar10;
  int *piVar11;
  reference pQVar12;
  uint *puVar13;
  int in_ESI;
  QFormLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  bool expanding;
  bool splitSideBySide;
  QFormLayoutItem *field_1;
  QFormLayoutItem *label_1;
  int i_1;
  bool prevRowSplit;
  QFormLayoutItem *prevItem2;
  QFormLayoutItem *prevItem1;
  QFormLayoutItem *field;
  QFormLayoutItem *label;
  int i;
  QWidget *widget;
  int userVSpacing;
  QStyle *style;
  bool addTopBottomStretch;
  bool wrapAllRows;
  RowWrapPolicy rowWrapPolicy;
  int vidx;
  int rr;
  QFormLayout *q;
  Alignment formAlignment;
  int stretch2;
  int stretch1;
  QSize max2;
  QSize max1;
  QSize sh2;
  QSize sh1;
  QSize min2;
  QSize min1;
  QFormLayoutItem *in_stack_fffffffffffffe68;
  QFormLayoutItem *in_stack_fffffffffffffe70;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  reference in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  bool local_166;
  byte local_165;
  QFormLayoutItem *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffebb;
  int in_stack_fffffffffffffebc;
  QWidget *in_stack_fffffffffffffec0;
  QFormLayoutItem *in_stack_fffffffffffffec8;
  bool local_11a;
  bool local_119;
  int local_110;
  int local_e8;
  bool local_e1;
  QFormLayoutItem *pQVar14;
  QFormLayoutItem *pQVar15;
  QFormLayoutItem *pQVar16;
  QFormLayoutItem *pQVar17;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar18;
  QFormLayoutItem *local_a8;
  int local_98;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_78;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_74;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  QFlagsStorageHelper<Qt::Orientation,_4> local_54;
  QFlagsStorageHelper<Qt::Orientation,_4> local_50;
  QFlagsStorageHelper<Qt::Orientation,_4> local_4c;
  QFlagsStorageHelper<Qt::Orientation,_4> local_48;
  int local_44;
  int local_40;
  QSize local_3c;
  QSize local_34;
  QSize local_2c;
  QSize local_24;
  QSize local_1c;
  QSize local_14;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if ((((in_ESI != in_RDI->layoutWidth) &&
       ((in_ESI < in_RDI->thresh_width || (in_RDI->layoutWidth < in_RDI->thresh_width)))) ||
      ((*(uint *)&in_RDI->field_0xb0 >> 0x12 & 3) != 0)) ||
     ((*(uint *)&in_RDI->field_0xb0 >> 0x14 & 3) != 0)) {
    in_RDI->layoutWidth = in_ESI;
    iVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::rowCount
                      ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x4b3b34);
    local_98 = 1;
    RVar4 = QFormLayout::rowWrapPolicy((QFormLayout *)in_stack_fffffffffffffe68);
    bVar2 = true;
    QList<QLayoutStruct>::clear((QList<QLayoutStruct> *)in_stack_fffffffffffffe70);
    QList<QLayoutStruct>::resize
              ((QList<QLayoutStruct> *)in_stack_fffffffffffffe80,
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78.i));
    local_a8 = (QFormLayoutItem *)0x0;
    iVar5 = QFormLayout::verticalSpacing
                      ((QFormLayout *)
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78.i));
    if ((iVar5 < 0) &&
       (pQVar9 = QLayout::parentWidget((QLayout *)in_stack_fffffffffffffe80),
       pQVar9 != (QWidget *)0x0)) {
      local_a8 = (QFormLayoutItem *)QWidget::style((QWidget *)in_stack_fffffffffffffe68);
    }
    updateSizes((QFormLayoutPrivate *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
    ;
    in_RDI->maxLabelWidth = 0;
    if (RVar4 == WrapAllRows) {
      in_RDI->maxLabelWidth = in_ESI;
    }
    else {
      for (iVar18 = 0; iVar18 < iVar3; iVar18 = iVar18 + 1) {
        ppQVar10 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                             ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)in_stack_fffffffffffffe70,
                              (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                              (int)in_stack_fffffffffffffe68);
        pQVar14 = *ppQVar10;
        ppQVar10 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                             ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)in_stack_fffffffffffffe70,
                              (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                              (int)in_stack_fffffffffffffe68);
        pQVar15 = *ppQVar10;
        if (pQVar14 != (QFormLayoutItem *)0x0) {
          iVar6 = QSize::width((QSize *)0x4b3ccd);
          if (pQVar15 == (QFormLayoutItem *)0x0) {
            local_110 = 0;
          }
          else {
            local_110 = QSize::width((QSize *)0x4b3cf0);
          }
          if (iVar6 + local_110 <= in_ESI) {
            local_c = QSize::width((QSize *)0x4b3d44);
            piVar11 = qMax<int>(&in_RDI->maxLabelWidth,&local_c);
            in_RDI->maxLabelWidth = *piVar11;
          }
        }
      }
    }
    pQVar15 = (QFormLayoutItem *)0x0;
    pQVar14 = (QFormLayoutItem *)0x0;
    local_e1 = false;
    for (local_e8 = 0; local_e8 < iVar3; local_e8 = local_e8 + 1) {
      ppQVar10 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                           ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)in_stack_fffffffffffffe70,
                            (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                            (int)in_stack_fffffffffffffe68);
      pQVar16 = *ppQVar10;
      ppQVar10 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                           ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)in_stack_fffffffffffffe70,
                            (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                            (int)in_stack_fffffffffffffe68);
      pQVar17 = *ppQVar10;
      bVar1 = QFormLayout::isRowVisible
                        ((QFormLayout *)
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         in_stack_fffffffffffffe8c);
      if (bVar1) {
        local_14 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        QSize::QSize((QSize *)in_stack_fffffffffffffe70);
        local_1c = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        QSize::QSize((QSize *)in_stack_fffffffffffffe70);
        local_24 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        QSize::QSize((QSize *)in_stack_fffffffffffffe70);
        local_2c = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        QSize::QSize((QSize *)in_stack_fffffffffffffe70);
        if (pQVar16 != (QFormLayoutItem *)0x0) {
          local_14 = pQVar16->minSize;
          local_24 = pQVar16->sizeHint;
        }
        if (pQVar17 != (QFormLayoutItem *)0x0) {
          local_1c = pQVar17->minSize;
          local_2c = pQVar17->sizeHint;
        }
        local_119 = false;
        if (RVar4 == WrapLongRows) {
          iVar18 = in_RDI->maxLabelWidth;
          iVar6 = QSize::width((QSize *)0x4b3f8a);
          local_11a = true;
          if (iVar6 <= iVar18) {
            iVar18 = in_RDI->maxLabelWidth;
            iVar6 = QSize::width((QSize *)0x4b3fc4);
            local_11a = in_ESI < iVar18 + iVar6;
          }
          local_119 = local_11a;
        }
        if ((RVar4 == WrapAllRows) || (local_119 != false)) {
          if (pQVar16 != (QFormLayoutItem *)0x0) {
            QList<QLayoutStruct>::operator[]
                      ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                       (qsizetype)in_stack_fffffffffffffe68);
            initLayoutStruct(in_stack_fffffffffffffe80,
                             (QFormLayoutItem *)
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78.i));
            if (1 < local_98) {
              in_stack_fffffffffffffe70 = pQVar14;
              in_stack_fffffffffffffe68 = pQVar15;
              in_stack_fffffffffffffec0 =
                   QLayout::parentWidget((QLayout *)in_stack_fffffffffffffe80);
              in_stack_fffffffffffffec8 = local_a8;
              in_stack_fffffffffffffebc =
                   spacingHelper((QWidget *)local_a8,(QStyle *)in_stack_fffffffffffffec0,
                                 in_stack_fffffffffffffebc,(bool)in_stack_fffffffffffffebb,
                                 (QFormLayoutItem *)
                                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                 in_stack_fffffffffffffea8,in_stack_fffffffffffffe70,
                                 in_stack_fffffffffffffe68);
              pQVar12 = QList<QLayoutStruct>::operator[]
                                  ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                                   (qsizetype)in_stack_fffffffffffffe68);
              pQVar12->spacing = in_stack_fffffffffffffebc;
            }
            pQVar16->vLayoutIndex = local_98;
            pQVar16->sideBySide = false;
            pQVar14 = (QFormLayoutItem *)0x0;
            pQVar12 = QList<QLayoutStruct>::operator[]
                                ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                                 (qsizetype)in_stack_fffffffffffffe68);
            if (0 < pQVar12->stretch) {
              bVar2 = false;
            }
            local_98 = local_98 + 1;
            pQVar15 = pQVar16;
          }
          if (pQVar17 != (QFormLayoutItem *)0x0) {
            QList<QLayoutStruct>::operator[]
                      ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                       (qsizetype)in_stack_fffffffffffffe68);
            initLayoutStruct(in_stack_fffffffffffffe80,
                             (QFormLayoutItem *)
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78.i));
            if (1 < local_98) {
              in_stack_fffffffffffffe70 = pQVar14;
              in_stack_fffffffffffffe68 = pQVar15;
              QLayout::parentWidget((QLayout *)in_stack_fffffffffffffe80);
              in_stack_fffffffffffffebb = true;
              if (local_119 == false) {
                in_stack_fffffffffffffebb = local_e1;
              }
              in_stack_fffffffffffffea8 = local_a8;
              in_stack_fffffffffffffeb4 = iVar5;
              iVar18 = spacingHelper((QWidget *)in_stack_fffffffffffffec8,
                                     (QStyle *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                                     (bool)in_stack_fffffffffffffebb,
                                     (QFormLayoutItem *)CONCAT44(iVar5,in_stack_fffffffffffffeb0),
                                     local_a8,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
              pQVar12 = QList<QLayoutStruct>::operator[]
                                  ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                                   (qsizetype)in_stack_fffffffffffffe68);
              pQVar12->spacing = iVar18;
            }
            pQVar17->vLayoutIndex = local_98;
            pQVar17->sideBySide = false;
            pQVar14 = (QFormLayoutItem *)0x0;
            pQVar12 = QList<QLayoutStruct>::operator[]
                                ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                                 (qsizetype)in_stack_fffffffffffffe68);
            if (0 < pQVar12->stretch) {
              bVar2 = false;
            }
            local_98 = local_98 + 1;
            pQVar15 = pQVar17;
          }
          local_e1 = local_119;
        }
        else {
          local_34 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
          QSize::QSize((QSize *)in_stack_fffffffffffffe70,
                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (int)in_stack_fffffffffffffe68);
          local_3c = (QSize)&DAT_aaaaaaaaaaaaaaaa;
          QSize::QSize((QSize *)in_stack_fffffffffffffe70,
                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (int)in_stack_fffffffffffffe68);
          local_40 = 0;
          local_44 = 0;
          bVar1 = false;
          if (pQVar16 != (QFormLayoutItem *)0x0) {
            local_34 = pQVar16->maxSize;
            local_4c.super_QFlagsStorage<Qt::Orientation>.i =
                 (QFlagsStorage<Qt::Orientation>)
                 QFormLayoutItem::expandingDirections(in_stack_fffffffffffffe68);
            local_48.super_QFlagsStorage<Qt::Orientation>.i =
                 (QFlagsStorage<Qt::Orientation>)
                 QFlags<Qt::Orientation>::operator&
                           ((QFlags<Qt::Orientation> *)in_stack_fffffffffffffe70,
                            (Orientation)((ulong)in_stack_fffffffffffffe68 >> 0x20));
            IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_48);
            bVar1 = IVar7 != 0;
            pQVar16->sideBySide = pQVar17 != (QFormLayoutItem *)0x0;
            pQVar16->vLayoutIndex = local_98;
            local_40 = QFormLayoutItem::vStretch(in_stack_fffffffffffffe70);
          }
          if (pQVar17 != (QFormLayoutItem *)0x0) {
            local_3c = pQVar17->maxSize;
            local_54.super_QFlagsStorage<Qt::Orientation>.i =
                 (QFlagsStorage<Qt::Orientation>)
                 QFormLayoutItem::expandingDirections(in_stack_fffffffffffffe68);
            local_50.super_QFlagsStorage<Qt::Orientation>.i =
                 (QFlagsStorage<Qt::Orientation>)
                 QFlags<Qt::Orientation>::operator&
                           ((QFlags<Qt::Orientation> *)in_stack_fffffffffffffe70,
                            (Orientation)((ulong)in_stack_fffffffffffffe68 >> 0x20));
            IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_50);
            if (IVar7 != 0) {
              bVar1 = true;
            }
            local_165 = 1;
            if (pQVar16 == (QFormLayoutItem *)0x0) {
              local_165 = pQVar17->fullRow ^ 0xff;
            }
            pQVar17->sideBySide = (bool)(local_165 & 1);
            pQVar17->vLayoutIndex = local_98;
            local_44 = QFormLayoutItem::vStretch(in_stack_fffffffffffffe70);
          }
          in_stack_fffffffffffffe80 =
               QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                          (qsizetype)in_stack_fffffffffffffe68);
          puVar13 = (uint *)qMax<int>(&local_40,&local_44);
          in_stack_fffffffffffffe8c = *puVar13;
          local_58 = QSize::height((QSize *)0x4b451a);
          local_5c = QSize::height((QSize *)0x4b452e);
          qMax<int>(&local_58,&local_5c);
          QLayoutStruct::init(in_stack_fffffffffffffe80,
                              (EVP_PKEY_CTX *)(ulong)in_stack_fffffffffffffe8c);
          local_60 = QSize::height((QSize *)0x4b4567);
          local_64 = QSize::height((QSize *)0x4b457b);
          piVar11 = qMax<int>(&local_60,&local_64);
          in_stack_fffffffffffffe90 = *piVar11;
          pQVar12 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                               (qsizetype)in_stack_fffffffffffffe68);
          pQVar12->sizeHint = in_stack_fffffffffffffe90;
          local_68 = QSize::height((QSize *)0x4b45cd);
          local_6c = QSize::height((QSize *)0x4b45e1);
          piVar11 = qMin<int>(&local_68,&local_6c);
          in_stack_fffffffffffffe94 = *piVar11;
          pQVar12 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                               (qsizetype)in_stack_fffffffffffffe68);
          pQVar12->maximumSize = in_stack_fffffffffffffe94;
          local_166 = true;
          if (!bVar1) {
            pQVar12 = QList<QLayoutStruct>::operator[]
                                ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                                 (qsizetype)in_stack_fffffffffffffe68);
            local_166 = 0 < pQVar12->stretch;
          }
          in_stack_fffffffffffffe7c = CONCAT13(local_166,(int3)in_stack_fffffffffffffe7c);
          pQVar12 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                               (qsizetype)in_stack_fffffffffffffe68);
          pQVar12->expansive = (bool)((byte)((uint)in_stack_fffffffffffffe7c >> 0x18) & 1);
          pQVar12 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                               (qsizetype)in_stack_fffffffffffffe68);
          pQVar12->empty = false;
          pQVar12 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                               (qsizetype)in_stack_fffffffffffffe68);
          if ((pQVar12->expansive & 1U) != 0) {
            bVar2 = false;
          }
          if (1 < local_98) {
            in_stack_fffffffffffffe70 = pQVar14;
            in_stack_fffffffffffffe68 = pQVar15;
            QLayout::parentWidget((QLayout *)in_stack_fffffffffffffe80);
            in_stack_fffffffffffffe78.i =
                 spacingHelper((QWidget *)in_stack_fffffffffffffec8,
                               (QStyle *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                               (bool)in_stack_fffffffffffffebb,
                               (QFormLayoutItem *)
                               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                               in_stack_fffffffffffffea8,in_stack_fffffffffffffe70,
                               in_stack_fffffffffffffe68);
            pQVar12 = QList<QLayoutStruct>::operator[]
                                ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                                 (qsizetype)in_stack_fffffffffffffe68);
            pQVar12->spacing = in_stack_fffffffffffffe78.i;
          }
          pQVar14 = pQVar17;
          if (pQVar16 == (QFormLayoutItem *)0x0) {
            pQVar14 = (QFormLayoutItem *)0x0;
            pQVar16 = pQVar17;
          }
          local_e1 = false;
          local_98 = local_98 + 1;
          pQVar15 = pQVar16;
        }
      }
      else {
        if (pQVar16 != (QFormLayoutItem *)0x0) {
          pQVar16->vLayoutIndex = -1;
        }
        if (pQVar17 != (QFormLayoutItem *)0x0) {
          pQVar17->vLayoutIndex = -1;
        }
      }
    }
    if (bVar2) {
      local_70.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)0xaaaaaaaa;
      local_70.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFormLayout::formAlignment((QFormLayout *)in_stack_fffffffffffffe70);
      local_74.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&
                     ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffe70,
                      (AlignmentFlag)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      bVar2 = QFlags<Qt::AlignmentFlag>::operator!((QFlags<Qt::AlignmentFlag> *)&local_74);
      if (bVar2) {
        pQVar12 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                             (qsizetype)in_stack_fffffffffffffe68);
        QLayoutStruct::init(pQVar12,(EVP_PKEY_CTX *)0x1);
        pQVar12 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                             (qsizetype)in_stack_fffffffffffffe68);
        pQVar12->expansive = true;
        local_98 = local_98 + 1;
      }
      Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                    (enum_type)in_stack_fffffffffffffe70);
      local_78.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QFlags<Qt::AlignmentFlag>::operator&
                     ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffe70,
                      (QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffffe78.i);
      IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_78);
      if (IVar8 == 0) {
        pQVar12 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                             (qsizetype)in_stack_fffffffffffffe68);
        QLayoutStruct::init(pQVar12,(EVP_PKEY_CTX *)0x0);
      }
      else {
        pQVar12 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                             (qsizetype)in_stack_fffffffffffffe68);
        QLayoutStruct::init(pQVar12,(EVP_PKEY_CTX *)0x1);
        pQVar12 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                             (qsizetype)in_stack_fffffffffffffe68);
        pQVar12->expansive = true;
      }
    }
    else {
      pQVar12 = QList<QLayoutStruct>::operator[]
                          ((QList<QLayoutStruct> *)in_stack_fffffffffffffe70,
                           (qsizetype)in_stack_fffffffffffffe68);
      QLayoutStruct::init(pQVar12,(EVP_PKEY_CTX *)0x0);
    }
    in_RDI->vLayoutCount = local_98;
    *(uint *)&in_RDI->field_0xb0 = *(uint *)&in_RDI->field_0xb0 & 0xfff3ffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayoutPrivate::setupVerticalLayoutData(int width)
{
    Q_Q(QFormLayout);

    // Early out if we have no changes that would cause a change in vertical layout
    if ((width == layoutWidth || (width >= thresh_width && layoutWidth >= thresh_width)) && !dirty && !sizesDirty)
        return;

    layoutWidth = width;

    int rr = m_matrix.rowCount();
    int vidx = 1;
    QFormLayout::RowWrapPolicy rowWrapPolicy = q->rowWrapPolicy();
    bool wrapAllRows = (rowWrapPolicy == QFormLayout::WrapAllRows);
    bool addTopBottomStretch = true;

    vLayouts.clear();
    vLayouts.resize((2 * rr) + 2); // a max, some may be unused

    QStyle *style = nullptr;

    int userVSpacing = q->verticalSpacing();

    if (userVSpacing < 0) {
        if (QWidget *widget = q->parentWidget())
            style = widget->style();
    }

    // make sure our sizes are up to date
    updateSizes();

    // Grab the widest label width here
    // This might be different from the value computed during
    // sizeHint/minSize, since we don't count label/field pairs that
    // are split.
    maxLabelWidth = 0;
    if (!wrapAllRows) {
        for (int i = 0; i < rr; ++i) {
            const QFormLayoutItem *label = m_matrix(i, 0);
            const QFormLayoutItem *field = m_matrix(i, 1);
            if (label && (label->sizeHint.width() + (field ? field->minSize.width() : 0) <= width))
                maxLabelWidth = qMax(maxLabelWidth, label->sizeHint.width());
        }
    } else {
        maxLabelWidth = width;
    }

    QFormLayoutItem *prevItem1 = nullptr;
    QFormLayoutItem *prevItem2 = nullptr;
    bool prevRowSplit = false;

    for (int i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // Ignore empty rows or rows with only hidden items,
        // and invalidate their position in the layout.
        if (!q->isRowVisible(i)) {
            if (label)
                label->vLayoutIndex = -1;
            if (field)
                field->vLayoutIndex = -1;
            continue;
        }

        QSize min1;
        QSize min2;
        QSize sh1;
        QSize sh2;
        if (label) {
            min1 = label->minSize;
            sh1 = label->sizeHint;
        }
        if (field) {
            min2 = field->minSize;
            sh2 = field->sizeHint;
        }

        // In separate lines, we make a vLayout for everything that isn't null
        // in side by side, we only separate label/field if we're going to wrap it
        bool splitSideBySide = (rowWrapPolicy == QFormLayout::WrapLongRows)
                                && ((maxLabelWidth < sh1.width()) || (width < (maxLabelWidth + min2.width())));

        if (wrapAllRows || splitSideBySide) {
            if (label) {
                initLayoutStruct(vLayouts[vidx], label);

                if (vidx > 1)
                    vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, splitSideBySide || prevRowSplit, label, nullptr, prevItem1, prevItem2);

                label->vLayoutIndex = vidx;
                label->sideBySide = false;

                prevItem1 = label;
                prevItem2 = nullptr;

                if (vLayouts[vidx].stretch > 0)
                    addTopBottomStretch = false;

                ++vidx;
            }

            if (field) {
                initLayoutStruct(vLayouts[vidx], field);

                if (vidx > 1)
                    vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, splitSideBySide || prevRowSplit, field, nullptr, prevItem1, prevItem2);

                field->vLayoutIndex = vidx;
                field->sideBySide = false;

                prevItem1 = field;
                prevItem2 = nullptr;

                if (vLayouts[vidx].stretch > 0)
                    addTopBottomStretch = false;

                ++vidx;
            }

            prevRowSplit = splitSideBySide;
        } else {
            // we're in side by side mode, and we have enough space to do that
            QSize max1(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
            QSize max2(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);

            int stretch1 = 0;
            int stretch2 = 0;
            bool expanding = false;

            if (label) {
                max1 = label->maxSize;
                if (label->expandingDirections() & Qt::Vertical)
                    expanding = true;

                label->sideBySide = (field != nullptr);
                label->vLayoutIndex = vidx;
                stretch1 = label->vStretch();
            }

            if (field) {
                max2 = field->maxSize;
                if (field->expandingDirections() & Qt::Vertical)
                    expanding = true;

                field->sideBySide = (label || !field->fullRow);
                field->vLayoutIndex = vidx;
                stretch2 = field->vStretch();
            }

            vLayouts[vidx].init(qMax(stretch1, stretch2), qMax(min1.height(), min2.height()));
            vLayouts[vidx].sizeHint = qMax(sh1.height(), sh2.height());
            vLayouts[vidx].maximumSize = qMin(max1.height(), max2.height());
            vLayouts[vidx].expansive = expanding || (vLayouts[vidx].stretch > 0);
            vLayouts[vidx].empty = false;

            if (vLayouts[vidx].expansive)
                addTopBottomStretch = false;

            if (vidx > 1)
                vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, prevRowSplit, label, field, prevItem1, prevItem2);

            if (label) {
                prevItem1 = label;
                prevItem2 = field;
            } else {
                prevItem1 = field;
                prevItem2 = nullptr;
            }

            prevRowSplit = false;
            ++vidx;
        }
    }

    if (addTopBottomStretch) {
        Qt::Alignment formAlignment = q->formAlignment();

        if (!(formAlignment & Qt::AlignBottom)) {
            // AlignTop (default if unspecified) or AlignVCenter: We add a stretch at the bottom
            vLayouts[vidx].init(1, 0);
            vLayouts[vidx].expansive = true;
            ++vidx;
        }

        if (formAlignment & (Qt::AlignVCenter | Qt::AlignBottom)) {
            // AlignVCenter or AlignBottom: We add a stretch at the top
            vLayouts[0].init(1, 0);
            vLayouts[0].expansive = true;
        } else {
            vLayouts[0].init(0, 0);
        }
    } else {
        vLayouts[0].init(0, 0);
    }

    vLayoutCount = vidx;
    dirty = false;
}